

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChNodeFEAxyz.h
# Opt level: O3

void __thiscall chrono::fea::ChNodeFEAxyz::VariablesQbSetSpeed(ChNodeFEAxyz *this,double step)

{
  double dVar1;
  undefined1 auVar2 [16];
  double dVar3;
  ChVector<double> local_88;
  RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_> local_68;
  ChVectorRef *local_50;
  undefined8 local_48;
  long local_38;
  ChVectorRef local_30;
  
  auVar2 = *(undefined1 (*) [16])&this->field_0x38;
  dVar1 = *(double *)&this->field_0x48;
  ChVariables::Get_qb(&local_30,&(this->variables).super_ChVariables);
  local_68._0_8_ =
       local_30.
       super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
       ._0_8_;
  local_68._8_8_ = 3;
  local_48 = 0;
  local_38 = local_30.
             super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
             ._8_8_;
  local_50 = &local_30;
  if (2 < (long)local_30.
                super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
                ._8_8_) {
    ChVector<double>::
    ChVector<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,_1,1,0,_1,1>,0,Eigen::InnerStride<1>>,_1,1,false>>
              (&local_88,
               (MatrixBase<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,__1,_1,_false>_>
                *)&local_68,(type *)0x0);
    if ((ChVector<double> *)&this->field_0x38 != &local_88) {
      *(double *)&this->field_0x38 = local_88.m_data[0];
      *(double *)&this->field_0x40 = local_88.m_data[1];
      *(double *)&this->field_0x48 = local_88.m_data[2];
    }
    if ((step != 0.0) || (NAN(step))) {
      auVar2 = vsubpd_avx(*(undefined1 (*) [16])&this->field_0x38,auVar2);
      dVar3 = 1.0 / step;
      *(double *)&this->field_0x50 = dVar3 * auVar2._0_8_;
      *(double *)&this->field_0x58 = dVar3 * auVar2._8_8_;
      *(double *)&this->field_0x60 = dVar3 * (*(double *)&this->field_0x48 - dVar1);
    }
    return;
  }
  __assert_fail("startRow >= 0 && blockRows >= 0 && startRow <= xpr.rows() - blockRows && startCol >= 0 && blockCols >= 0 && startCol <= xpr.cols() - blockCols"
                ,"/usr/include/eigen3/Eigen/src/Core/Block.h",0x93,
                "Eigen::Block<Eigen::Ref<Eigen::Matrix<double, -1, 1>>, -1, 1>::Block(XprType &, Index, Index, Index, Index) [XprType = Eigen::Ref<Eigen::Matrix<double, -1, 1>>, BlockRows = -1, BlockCols = 1, InnerPanel = false]"
               );
}

Assistant:

virtual void VariablesQbSetSpeed(double step = 0) override {
        ChVector<> old_dt = pos_dt;
        SetPos_dt(variables.Get_qb().segment(0, 3));
        if (step) {
            SetPos_dtdt((pos_dt - old_dt) / step);
        }
    }